

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O2

void __thiscall
OpenMPDeclareSimdDirective::OpenMPDeclareSimdDirective(OpenMPDeclareSimdDirective *this)

{
  OpenMPDirective::OpenMPDirective(&this->super_OpenMPDirective,OMPD_declare_simd,Lang_unknown,0,0);
  (this->proc_name)._M_dataplus._M_p = (pointer)&(this->proc_name).field_2;
  (this->proc_name)._M_string_length = 0;
  (this->proc_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

std::string getProcName() { return proc_name;}